

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.h
# Opt level: O2

void __thiscall flow::lang::ASTNode::~ASTNode(ASTNode *this)

{
  this->_vptr_ASTNode = (_func_int **)&PTR__ASTNode_001937c0;
  std::__cxx11::string::~string((string *)&this->location_);
  return;
}

Assistant:

virtual ~ASTNode() {}